

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

QHttp2Stream * __thiscall
QHttp2Connection::createStreamInternal_impl(QHttp2Connection *this,quint32 streamID)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QPointer<QHttp2Stream> *stream;
  TryEmplaceResult result;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  uint *in_stack_ffffffffffffff28;
  QHttp2Connection *in_stack_ffffffffffffff30;
  char local_58 [24];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(int *)(in_RDI + 0x10) != 0) || ((*(byte *)(in_RDI + 0x2b0) & 1) != 0)) ||
     (bVar1 = sendClientPreface(in_stack_ffffffffffffff30), bVar1)) {
    QHash<unsigned_int,QPointer<QHttp2Stream>>::tryEmplace<decltype(nullptr)>
              ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,
               (void **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  else {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    qHttp2ConnectionLog();
    anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x2b56c3);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff24,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (char *)0x2b56dc);
      QMessageLogger::warning(local_58,"[%p] Failed to send client preface",in_RDI);
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QHttp2Stream *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Stream *QHttp2Connection::createStreamInternal_impl(quint32 streamID)
{
    Q_ASSERT(streamID > m_lastIncomingStreamID || streamID >= m_nextStreamID);

    if (m_connectionType == Type::Client && !m_prefaceSent && !sendClientPreface()) {
        qCWarning(qHttp2ConnectionLog, "[%p] Failed to send client preface", this);
        return nullptr;
    }

    auto result = m_streams.tryEmplace(streamID, nullptr);
    if (!result.inserted)
        return nullptr;
    QPointer<QHttp2Stream> &stream = result.iterator.value();
    stream = new QHttp2Stream(this, streamID);
    stream->m_recvWindow = streamInitialReceiveWindowSize;
    stream->m_sendWindow = streamInitialSendWindowSize;

    connect(stream, &QHttp2Stream::uploadBlocked, this, [this, stream] {
        m_blockedStreams.insert(stream->streamID());
    });
    *result.iterator = stream;
    return *result.iterator;
}